

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O2

Status __thiscall
leveldb::FaultInjectionTestEnv::NewAppendableFile
          (FaultInjectionTestEnv *this,string *fname,WritableFile **result)

{
  string *psVar1;
  bool bVar2;
  size_type *psVar3;
  mapped_type *pmVar4;
  TestWritableFile *this_00;
  undefined8 *in_RCX;
  string *psVar5;
  WritableFile *actual_writable_file;
  FileState state;
  
  (**(code **)(*(long *)fname->_M_string_length + 0x28))();
  if ((this->super_EnvWrapper).super_Env._vptr_Env == (_func_int **)0x0) {
    anon_unknown_7::FileState::FileState(&state,(string *)result);
    state.pos_ = 0;
    std::mutex::lock((mutex *)&fname->field_2);
    psVar3 = &fname[2]._M_string_length;
    psVar5 = fname + 2;
    while (psVar1 = (string *)*psVar3, psVar1 != (string *)0x0) {
      bVar2 = std::operator<(psVar1 + 1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             result);
      if (!bVar2) {
        psVar5 = psVar1;
      }
      psVar3 = (size_type *)((long)&psVar1->field_2 + (ulong)bVar2 * 8);
    }
    if ((psVar5 == fname + 2) ||
       (bVar2 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               result,psVar5 + 1), bVar2)) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&fname[3]._M_string_length,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
                             *)((long)&fname[1].field_2 + 8),(key_type *)result);
      anon_unknown_7::FileState::operator=(&state,pmVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&fname->field_2);
    this_00 = (TestWritableFile *)operator_new(0x58);
    TestWritableFile::TestWritableFile
              (this_00,&state,actual_writable_file,(FaultInjectionTestEnv *)fname);
    *in_RCX = this_00;
    std::__cxx11::string::~string((string *)&state);
    return (Status)(char *)this;
  }
  return (Status)(char *)this;
}

Assistant:

Status FaultInjectionTestEnv::NewAppendableFile(const std::string& fname,
                                                WritableFile** result) {
  WritableFile* actual_writable_file;
  Status s = target()->NewAppendableFile(fname, &actual_writable_file);
  if (s.ok()) {
    FileState state(fname);
    state.pos_ = 0;
    {
      MutexLock l(&mutex_);
      if (db_file_state_.count(fname) == 0) {
        new_files_since_last_dir_sync_.insert(fname);
      } else {
        state = db_file_state_[fname];
      }
    }
    *result = new TestWritableFile(state, actual_writable_file, this);
  }
  return s;
}